

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

char * fct_clp__optval2(fct_clp_t *clp,char *option,char *default_val)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  fctcl_t *clo;
  bool bVar4;
  
  if (clp == (fct_clp_t *)0x0) {
    __assert_fail("clp != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x6d2
                  ,"const char *fct_clp__optval2(fct_clp_t *, const char *, const char *)");
  }
  sVar1 = (clp->clo_list).used_itm_num;
  if (sVar1 == 0) {
    clo = (fctcl_t *)0x0;
  }
  else {
    uVar3 = 0;
    do {
      if ((clp->clo_list).used_itm_num <= uVar3) {
        __assert_fail("idx < list->used_itm_num",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x322,"void *fct_nlist__at(const fct_nlist_t *, size_t)");
      }
      clo = (fctcl_t *)(clp->clo_list).itm_list[uVar3];
      iVar2 = fctcl__is_option(clo,option);
    } while ((iVar2 == 0) &&
            (bVar4 = sVar1 - 1 != uVar3, uVar3 = uVar3 + 1, clo = (fctcl_t *)0x0, bVar4));
  }
  if ((clo != (fctcl_t *)0x0) && (clo->value != (char *)0x0)) {
    default_val = clo->value;
  }
  return default_val;
}

Assistant:

static char const*
fct_clp__optval2(fct_clp_t *clp, char const *option, char const *default_val)
{
    fctcl_t const *clo =NULL;
    FCT_ASSERT( clp != NULL );
    FCT_ASSERT( option != NULL );
    clo = fct_clp__get_clo(clp, option);
    if ( clo == NULL || clo->value == NULL)
    {
        return default_val;
    }
    return clo->value;
}